

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O2

If_Man_t * Abc_NtkToIf(Abc_Ntk_t *pNtk,If_Par_t *pPars)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  If_Obj_t *pIVar2;
  If_Man_t *p;
  size_t sVar3;
  char *__dest;
  Abc_Obj_t *pAVar4;
  If_Obj_t *pIVar5;
  ProgressBar *p_00;
  Vec_Ptr_t *p_01;
  long *plVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                  ,0xd9,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
  }
  p = If_ManStart(pPars);
  pcVar9 = pNtk->pName;
  if (pcVar9 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar9);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,pcVar9);
  }
  p->pName = __dest;
  if (1.0 < (double)p->nObjBytes * (double)pNtk->nObjs * 9.313225746154785e-10) {
    printf(
          "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n"
          );
  }
  Abc_NtkCleanCopy(pNtk);
  aVar1 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p->pConst1;
  pAVar4 = Abc_AigConst1(pNtk);
  pAVar4->field_6 = aVar1;
  for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,iVar8);
    pIVar5 = If_ManCreateCi(p);
    (pAVar4->field_6).pCopy = (Abc_Obj_t *)pIVar5;
    *(uint *)pIVar5 = (*(uint *)pIVar5 & 0x1fff) + (*(uint *)&pAVar4->field_0x14 & 0xfffff000) * 2;
  }
  p_00 = Extra_ProgressBarStart(_stdout,pNtk->vObjs->nSize);
  iVar8 = 0;
  p_01 = Abc_AigDfs(pNtk,0,0);
  while( true ) {
    if (p_01->nSize <= iVar8) {
      Extra_ProgressBarStop(p_00);
      free(p_01->pArray);
      free(p_01);
      for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
        pAVar4 = Abc_NtkCo(pNtk,iVar8);
        pIVar5 = If_ManCreateCo(p,(If_Obj_t *)
                                  ((ulong)(*(uint *)&pAVar4->field_0x14 >> 10 & 1) ^
                                  *(ulong *)((long)pAVar4->pNtk->vObjs->pArray
                                                   [*(pAVar4->vFanins).pArray] + 0x40)));
        (pAVar4->field_6).pCopy = (Abc_Obj_t *)pIVar5;
      }
      return p;
    }
    plVar6 = (long *)Vec_PtrEntry(p_01,iVar8);
    Extra_ProgressBarUpdate(p_00,iVar8,"Initial");
    lVar7 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
    pIVar5 = If_ManCreateAnd(p,(If_Obj_t *)
                               ((ulong)(*(uint *)((long)plVar6 + 0x14) >> 10 & 1) ^
                               *(ulong *)(*(long *)(lVar7 + (long)*(int *)plVar6[4] * 8) + 0x40)),
                             (If_Obj_t *)
                             ((ulong)(*(uint *)((long)plVar6 + 0x14) >> 0xb & 1) ^
                             *(ulong *)(*(long *)(lVar7 + (long)((int *)plVar6[4])[1] * 8) + 0x40)))
    ;
    plVar6[8] = (long)pIVar5;
    if (((ulong)plVar6 & 1) != 0) break;
    if (*(int *)*plVar6 != 3) {
      pcVar9 = "Abc_NtkIsStrash(pNode->pNtk)";
      goto LAB_0029325a;
    }
    lVar7 = plVar6[7];
    if ((lVar7 != 0) && (0 < *(int *)((long)plVar6 + 0x2c))) {
      if (pIVar5->Id <= *(int *)(*(long *)(lVar7 + 0x40) + 4)) {
        __assert_fail("If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                      ,0xfd,"If_Man_t *Abc_NtkToIf(Abc_Ntk_t *, If_Par_t *)");
      }
      for (; lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x38)) {
        pIVar2 = *(If_Obj_t **)(lVar7 + 0x40);
        pIVar5->pEquiv = pIVar2;
        pIVar5 = pIVar2;
      }
      If_ManCreateChoice(p,(If_Obj_t *)plVar6[8]);
    }
    iVar8 = iVar8 + 1;
  }
  pcVar9 = "!Abc_ObjIsComplement(pNode)";
LAB_0029325a:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
}

Assistant:

If_Man_t * Abc_NtkToIf( Abc_Ntk_t * pNtk, If_Par_t * pPars )
{
    ProgressBar * pProgress;
    If_Man_t * pIfMan;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );

    // print warning about excessive memory usage
    if ( 1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30) > 1.0 )
        printf( "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n", 
            1.0 * Abc_NtkObjNum(pNtk) * pIfMan->nObjBytes / (1<<30), Abc_NtkObjNum(pNtk) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)If_ManConst1( pIfMan );
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCi( pIfMan );
        // transfer logic level information
        Abc_ObjIfCopy(pNode)->Level = pNode->Level;
    }

    // load the AIG into the mapper
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, "Initial" );
        // add the node to the mapper
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateAnd( pIfMan, 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ), 
            If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin1(pNode)), Abc_ObjFaninC1(pNode) ) );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
        {
            Abc_Obj_t * pEquiv;
//            int Counter = 0;
            assert( If_ObjId(Abc_ObjIfCopy(pNode)) > If_ObjId(Abc_ObjIfCopy(Abc_ObjEquiv(pNode))) );
            for ( pPrev = pNode, pEquiv = Abc_ObjEquiv(pPrev); pEquiv; pPrev = pEquiv, pEquiv = Abc_ObjEquiv(pPrev) )
                If_ObjSetChoice( Abc_ObjIfCopy(pPrev), Abc_ObjIfCopy(pEquiv) );//, Counter++;
//            printf( "%d ", Counter );
            If_ManCreateChoice( pIfMan, Abc_ObjIfCopy(pNode) );
        }
    }
    Extra_ProgressBarStop( pProgress );
    Vec_PtrFree( vNodes );

    // set the primary outputs without copying the phase
    Abc_NtkForEachCo( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)If_ManCreateCo( pIfMan, If_NotCond( Abc_ObjIfCopy(Abc_ObjFanin0(pNode)), Abc_ObjFaninC0(pNode) ) );
    return pIfMan;
}